

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_seek.c
# Opt level: O0

int64_t mpt_stream_seek(mpt_stream *stream,int64_t pos,int mode)

{
  uint uVar1;
  __off_t _Var2;
  int local_40;
  int file;
  int flags;
  off_t add;
  mpt_queue *qu;
  int64_t iStack_20;
  int mode_local;
  int64_t pos_local;
  mpt_stream *stream_local;
  
  uVar1 = mpt_stream_flags(&stream->_info);
  if ((pos < 0) && (0 < pos)) {
    return -2;
  }
  _file = (mpt_stream *)0x0;
  iStack_20 = pos;
  if ((uVar1 & 3) == 0) {
    if ((stream->_rd)._dec != (mpt_data_decoder_t)0x0) {
      return -1;
    }
    add = (off_t)&stream->_rd;
    if ((mode == 1) && ((uVar1 & 0x10) != 0)) {
      iStack_20 = pos - (stream->_rd).data.len;
      _file = (mpt_stream *)(stream->_rd).data.off;
    }
    local_40 = _mpt_stream_fread(&stream->_info);
    memcpy(&(stream->_rd)._state,&mpt_stream_seek::def_dec,0x28);
  }
  else {
    if ((uVar1 & 3) != 1) {
      return -1;
    }
    if ((stream->_wd)._enc != (mpt_data_encoder_t)0x0) {
      return -1;
    }
    if ((stream->_wd)._state.scratch != 0) {
      return -4;
    }
    mpt_stream_flush(stream);
    add = (off_t)&stream->_wd;
    if ((mode == 1) && ((uVar1 & 0x20) != 0)) {
      iStack_20 = (stream->_wd).data.len + pos;
    }
    local_40 = _mpt_stream_fread(&stream->_info);
    (stream->_wd)._state._ctx = 0;
    (stream->_wd)._state.done = 0;
    (stream->_wd)._state.scratch = 0;
  }
  if (local_40 < 0) {
    stream_local = _file;
  }
  else {
    _Var2 = lseek(local_40,iStack_20,mode);
    if (_Var2 < 0) {
      stream_local = (mpt_stream *)0xfffffffffffffffc;
    }
    else {
      *(undefined8 *)(add + 8) = 0;
      *(undefined8 *)(add + 0x18) = 0;
      stream_local = (mpt_stream *)((long)&(_file->_info)._fd + _Var2);
    }
  }
  return (int64_t)stream_local;
}

Assistant:

extern int64_t mpt_stream_seek(MPT_STRUCT(stream) *stream, int64_t pos, int mode)
{
	static const MPT_STRUCT(decode_state) def_dec = MPT_DECODE_INIT;
	static const MPT_STRUCT(encode_state) def_enc = MPT_ENCODE_INIT;
	MPT_STRUCT(queue) *qu;
	off_t add;
	int flags, file = -1;
	
	flags = mpt_stream_flags(&stream->_info);
	
	if ((add = pos) < 0 && pos > 0) {
		return MPT_ERROR(BadValue);
	}
	add = 0;
	switch (flags & (MPT_STREAMFLAG(Write) | MPT_STREAMFLAG(RdWr))) {
	    case MPT_STREAMFLAG(Read):
		if (stream->_rd._dec) {
			return MPT_ERROR(BadArgument);
		}
		qu = &stream->_rd.data;
		if (mode == SEEK_CUR && (flags & MPT_STREAMFLAG(ReadBuf))) {
			pos -= qu->len;
			add = qu->off;
		}
		file = _mpt_stream_fread(&stream->_info);
		stream->_rd._state = def_dec;
		break;
	    case MPT_STREAMFLAG(Write):
		if (stream->_wd._enc) {
			return MPT_ERROR(BadArgument);
		}
		if (stream->_wd._state.scratch) {
			return MPT_ERROR(BadOperation);
		}
		mpt_stream_flush(stream);
		qu = &stream->_wd.data;
		if (mode == SEEK_CUR && (flags & MPT_STREAMFLAG(WriteBuf))) {
			pos += qu->len;
		}
		file = _mpt_stream_fread(&stream->_info);
		stream->_wd._state = def_enc;
		break;
	    default:
		return MPT_ERROR(BadArgument);
	}
	if (file < 0) {
		return add;
	}
	if ((pos = lseek(file, pos, mode)) < 0) {
		return MPT_ERROR(BadOperation);
	}
	qu->len = 0;
	qu->off = 0;
	
	return pos + add;
}